

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

size_t __thiscall slang::SourceManager::getColumnNumber(SourceManager *this,SourceLocation location)

{
  FileData *pFVar1;
  BufferID buffer;
  FileInfo *pFVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_t sVar5;
  bool bVar6;
  size_t local_40;
  size_t lineStart;
  FileData *fd;
  FileInfo *info;
  SourceManager *this_local;
  SourceLocation location_local;
  
  this_local = (SourceManager *)location;
  buffer = SourceLocation::buffer((SourceLocation *)&this_local);
  pFVar2 = getFileInfo(this,buffer);
  if ((pFVar2 == (FileInfo *)0x0) || (pFVar2->data == (FileData *)0x0)) {
    location_local = (SourceLocation)0x0;
  }
  else {
    pFVar1 = pFVar2->data;
    local_40 = SourceLocation::offset((SourceLocation *)&this_local);
    sVar3 = std::vector<char,_std::allocator<char>_>::size(&pFVar1->mem);
    if (sVar3 <= local_40) {
      assert::assertFailed
                ("lineStart < fd->mem.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0x40,"size_t slang::SourceManager::getColumnNumber(SourceLocation) const");
    }
    while( true ) {
      bVar6 = false;
      if (local_40 != 0) {
        pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&pFVar1->mem,local_40 - 1);
        bVar6 = false;
        if (*pvVar4 != '\n') {
          pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](&pFVar1->mem,local_40 - 1);
          bVar6 = *pvVar4 != '\r';
        }
      }
      if (!bVar6) break;
      local_40 = local_40 - 1;
    }
    sVar5 = SourceLocation::offset((SourceLocation *)&this_local);
    location_local = (SourceLocation)((sVar5 - local_40) + 1);
  }
  return (size_t)location_local;
}

Assistant:

size_t SourceManager::getColumnNumber(SourceLocation location) const {
    auto info = getFileInfo(location.buffer());

    // LOCKING: don't need a lock here, data is always valid once loaded.
    if (!info || !info->data)
        return 0;

    // walk backward to find start of line
    auto fd = info->data;
    size_t lineStart = location.offset();
    ASSERT(lineStart < fd->mem.size());
    while (lineStart > 0 && fd->mem[lineStart - 1] != '\n' && fd->mem[lineStart - 1] != '\r')
        lineStart--;

    return location.offset() - lineStart + 1;
}